

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::new_line(basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this)

{
  string_type *psVar1;
  int i;
  int iVar2;
  string local_60 [8];
  size_t local_58;
  value_type *local_40 [4];
  
  psVar1 = &(this->options_).new_line_chars_;
  std::__cxx11::string::string((string *)local_40,(string *)psVar1);
  std::__cxx11::string::string(local_60,(string *)psVar1);
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  append(&this->sink_,local_40[0],local_58);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)local_40);
  for (iVar2 = 0; iVar2 < this->indent_amount_; iVar2 = iVar2 + 1) {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(&this->sink_,' ');
  }
  this->column_ = (long)this->indent_amount_;
  return;
}

Assistant:

void new_line()
        {
            sink_.append(options_.new_line_chars().data(),options_.new_line_chars().length());
            for (int i = 0; i < indent_amount_; ++i)
            {
                sink_.push_back(' ');
            }
            column_ = indent_amount_;
        }